

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

void ssh2channel_request_pty(SshChannel *sc,_Bool want_reply,Conf *conf,int w,int h)

{
  char *str;
  long lVar1;
  code *handler;
  ssh_ttymodes *psVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 auStack_a78 [161];
  uint local_570;
  BinarySink *local_568;
  BinarySink *local_560;
  ssh_ttymodes local_558;
  PktOut *local_48;
  PktOut *pktout;
  strbuf *modebuf;
  ssh2_connection_state *s;
  ssh2_channel *c;
  int h_local;
  int w_local;
  Conf *conf_local;
  SshChannel *pSStack_10;
  _Bool want_reply_local;
  SshChannel *sc_local;
  
  bVar4 = 0;
  s = (ssh2_connection_state *)(sc + -0xb);
  modebuf = *(strbuf **)s;
  handler = (cr_handler_fn_t)0x0;
  if (want_reply) {
    handler = ssh2_channel_response;
  }
  c._0_4_ = h;
  c._4_4_ = w;
  _h_local = conf;
  conf_local._7_1_ = want_reply;
  pSStack_10 = sc;
  local_48 = ssh2_chanreq_init((ssh2_channel *)s,"pty-req",handler,(void *)0x0);
  local_568 = local_48->binarysink_;
  str = conf_get_str(_h_local,0x35);
  BinarySink_put_stringz(local_568,str);
  BinarySink_put_uint32(local_48->binarysink_,(long)c._4_4_);
  BinarySink_put_uint32(local_48->binarysink_,(long)(int)c);
  BinarySink_put_uint32(local_48->binarysink_,0);
  BinarySink_put_uint32(local_48->binarysink_,0);
  pktout = (PktOut *)strbuf_new();
  local_560 = (BinarySink *)&pktout->minlen;
  get_ttymodes_from_conf(&local_558,(Seat *)modebuf[6].len,_h_local);
  psVar2 = &local_558;
  puVar3 = auStack_a78;
  for (lVar1 = 0xa1; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)psVar2->have_mode;
    psVar2 = (ssh_ttymodes *)((long)psVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_570 = local_558.mode_val[0x101];
  write_ttymodes_to_packet(local_560,2);
  BinarySink_put_stringsb(local_48->binarysink_,(strbuf *)pktout);
  pq_base_push((PacketQueueBase *)modebuf[5].len,&local_48->qnode);
  return;
}

Assistant:

void ssh2channel_request_pty(
    SshChannel *sc, bool want_reply, Conf *conf, int w, int h)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;
    strbuf *modebuf;

    PktOut *pktout = ssh2_chanreq_init(
        c, "pty-req", want_reply ? ssh2_channel_response : NULL, NULL);
    put_stringz(pktout, conf_get_str(conf, CONF_termtype));
    put_uint32(pktout, w);
    put_uint32(pktout, h);
    put_uint32(pktout, 0);             /* pixel width */
    put_uint32(pktout, 0);             /* pixel height */
    modebuf = strbuf_new();
    write_ttymodes_to_packet(
        BinarySink_UPCAST(modebuf), 2,
        get_ttymodes_from_conf(s->ppl.seat, conf));
    put_stringsb(pktout, modebuf);
    pq_push(s->ppl.out_pq, pktout);
}